

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O3

void __thiscall summarycalc::dofmsummary(summarycalc *this)

{
  size_t sVar1;
  ostream *poVar2;
  char *pcVar3;
  int i;
  long lVar4;
  uint samplesize;
  uint streamtype;
  int local_3c;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"input/fmsummaryxref.bin","");
  loadsummaryxref(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  lVar4 = 0;
  do {
    if (this->fout[lVar4] != (FILE *)0x0) {
      outputstreamtype(this,(int)lVar4);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffff00000000;
  sVar1 = fread(&local_38,4,1,_stdin);
  if ((int)sVar1 == 0) {
    poVar2 = (ostream *)&std::cerr;
    pcVar3 = "FATAL: summarycalc: Read error on stream\n";
    lVar4 = 0x29;
  }
  else {
    if (((uint)local_38._M_dataplus._M_p >> 0x19 & 1) != 0) {
      local_3c = 0;
      sVar1 = fread(&local_3c,4,1,_stdin);
      if ((int)sVar1 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"FATAL: summarycalc: Read error on stream\n",0x29);
      }
      else {
        dosummaryprocessing(this,local_3c);
      }
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"FATAL: summarycalc: Not a fm stream\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"FATAL: summarycalc: invalid stream type: ",0x29);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    pcVar3 = "\n";
    lVar4 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,lVar4);
  exit(-1);
}

Assistant:

void summarycalc::dofmsummary()
{
	loadsummaryxref(FMSUMMARYXREF_FILE);
	outputstreamtype();
	unsigned int streamtype = 0;
	int i = (int) fread(&streamtype, sizeof(streamtype), 1, stdin);
	if (i) {
		if (isFMStream(streamtype) == true) {
			unsigned int samplesize = 0;
			i = (int) fread(&samplesize, sizeof(samplesize), 1, stdin);
			if (i)	dosummaryprocessing(samplesize);
			else std::cerr << "FATAL: summarycalc: Read error on stream\n";
			return;
		}
		else {
			std::cerr << "FATAL: summarycalc: Not a fm stream\n";
			std::cerr << "FATAL: summarycalc: invalid stream type: " << streamtype << "\n";
		}
	}
	else {
		std::cerr << "FATAL: summarycalc: Read error on stream\n";
	}
	::exit(-1);

}